

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# h264d_sps.c
# Opt level: O1

MPP_RET activate_sps(H264dVideoCtx_t *p_Vid,H264_SPS_t *sps,H264_subSPS_t *subset_sps)

{
  uint uVar1;
  int iVar2;
  h264_sps_t *phVar3;
  h264_dec_ctx_t *phVar4;
  h264_dpb_buf_t *phVar5;
  MPP_RET MVar6;
  RK_U32 RVar7;
  int iVar8;
  undefined8 in_RAX;
  uint uVar9;
  RK_U32 RVar10;
  int iVar11;
  char *fmt;
  long lVar12;
  int iVar13;
  undefined8 uVar14;
  int iVar15;
  undefined4 uVar16;
  
  uVar16 = (undefined4)((ulong)in_RAX >> 0x20);
  if ((p_Vid == (H264dVideoCtx_t *)0x0 && sps == (H264_SPS_t *)0x0) &&
      subset_sps == (H264_subSPS_t *)0x0) {
    if (((byte)h264d_debug & 4) == 0) {
      return MPP_OK;
    }
    fmt = "input empty(%d).\n";
    MVar6 = MPP_OK;
    uVar14 = 0x245;
LAB_00190bb9:
    _mpp_log_l(4,"h264d_sps",fmt,(char *)0x0,uVar14);
    return MVar6;
  }
  if ((p_Vid->dec_pic != (h264_store_pic_t *)0x0) &&
     (MVar6 = exit_picture(p_Vid,&p_Vid->dec_pic), MVar6 < MPP_OK)) {
    if (((byte)h264d_debug & 4) == 0) {
      return MVar6;
    }
    fmt = "Function error(%d).\n";
    uVar14 = 0x247;
    goto LAB_00190bb9;
  }
  if (p_Vid->active_mvc_sps_flag == 0) {
    p_Vid->active_sps = sps;
    p_Vid->active_subsps = (h264_subsps_t *)0x0;
    p_Vid->active_sps_id[0] = sps->seq_parameter_set_id;
    p_Vid->active_sps_id[1] = 0;
    RVar7 = video_pars_changed(p_Vid,sps,'\0');
    if (RVar7 != 0) {
      if ((p_Vid->no_output_of_prior_pics_flag == 0) &&
         (MVar6 = flush_dpb(p_Vid->p_Dpb_layer[0],1), MVar6 < MPP_OK)) {
        if (((byte)h264d_debug & 4) == 0) {
          return MVar6;
        }
        fmt = "Function error(%d).\n";
        uVar14 = 0x263;
        goto LAB_00190bb9;
      }
      MVar6 = init_dpb(p_Vid,p_Vid->p_Dpb_layer[0],1);
      if (MVar6 < MPP_OK) {
        if (((byte)h264d_debug & 4) == 0) {
          return MVar6;
        }
        fmt = "Function error(%d).\n";
        uVar14 = 0x265;
        goto LAB_00190bb9;
      }
      phVar3 = p_Vid->active_sps;
      p_Vid->last_pic_width_in_mbs_minus1[0] = phVar3->pic_width_in_mbs_minus1;
      p_Vid->last_pic_height_in_map_units_minus1[0] = phVar3->pic_height_in_map_units_minus1;
      p_Vid->last_profile_idc[0] = phVar3->profile_idc;
      p_Vid->last_level_idc[0] = phVar3->level_idc;
      p_Vid->dpb_size[0] = p_Vid->p_Dpb_layer[0]->size;
      p_Vid->spspps_update = 1;
    }
    if (p_Vid->dpb_size[0] == 0) {
      MVar6 = MPP_ERR_VALUE;
      if (((byte)h264d_debug & 4) == 0) {
        return MPP_ERR_VALUE;
      }
      fmt = "value error(%d).\n";
      uVar14 = 0x26b;
      goto LAB_00190bb9;
    }
  }
  else {
    p_Vid->active_sps = &subset_sps->sps;
    p_Vid->active_subsps = subset_sps;
    p_Vid->active_sps_id[0] = 0;
    p_Vid->active_sps_id[1] = (subset_sps->sps).seq_parameter_set_id;
    RVar7 = video_pars_changed(p_Vid,&subset_sps->sps,'\x01');
    if (RVar7 != 0) {
      MVar6 = flush_dpb(p_Vid->p_Dpb_layer[1],2);
      if (MVar6 < MPP_OK) {
        if (((byte)h264d_debug & 4) == 0) {
          return MVar6;
        }
        fmt = "Function error(%d).\n";
        uVar14 = 0x24f;
        goto LAB_00190bb9;
      }
      MVar6 = init_dpb(p_Vid,p_Vid->p_Dpb_layer[1],2);
      if (MVar6 < MPP_OK) {
        if (((byte)h264d_debug & 4) == 0) {
          return MVar6;
        }
        fmt = "Function error(%d).\n";
        uVar14 = 0x250;
        goto LAB_00190bb9;
      }
      MVar6 = check_mvc_dpb(p_Vid,p_Vid->p_Dpb_layer[0],p_Vid->p_Dpb_layer[1]);
      if (MVar6 < MPP_OK) {
        if (((byte)h264d_debug & 4) == 0) {
          return MVar6;
        }
        fmt = "Function error(%d).\n";
        uVar14 = 0x251;
        goto LAB_00190bb9;
      }
      phVar3 = p_Vid->active_sps;
      phVar4 = p_Vid->p_Dec;
      p_Vid->last_pic_width_in_mbs_minus1[1] = phVar3->pic_width_in_mbs_minus1;
      p_Vid->last_pic_height_in_map_units_minus1[1] = phVar3->pic_height_in_map_units_minus1;
      p_Vid->last_profile_idc[1] = phVar3->profile_idc;
      p_Vid->last_level_idc[1] = phVar3->level_idc;
      phVar5 = p_Vid->p_Dpb_layer[1];
      p_Vid->dpb_size[1] = phVar5->size;
      p_Vid->spspps_update = 1;
      if ((phVar4->mvc_valid != '\0') && (uVar1 = phVar5->size, uVar1 != 0)) {
        uVar9 = 8;
        if (uVar1 < 8) {
          uVar9 = uVar1;
        }
        p_Vid->p_Dpb_layer[0]->size = uVar9;
        p_Vid->dpb_size[0] = uVar9;
      }
    }
    if (p_Vid->dpb_size[1] == 0) {
      MVar6 = MPP_ERR_VALUE;
      if (((byte)h264d_debug & 4) == 0) {
        return MPP_ERR_VALUE;
      }
      fmt = "value error(%d).\n";
      uVar14 = 0x25b;
      goto LAB_00190bb9;
    }
  }
  if ((h264d_debug._1_1_ & 1) != 0) {
    _mpp_log_l(4,"h264d_sps","[DPB_size] dpb_size[0]=%d, mvc_flag=%d, dpb_size[1]=%d",(char *)0x0,
               (ulong)p_Vid->dpb_size[0],(ulong)(uint)p_Vid->active_mvc_sps_flag,
               CONCAT44(uVar16,p_Vid->dpb_size[1]));
  }
  phVar3 = p_Vid->active_sps;
  p_Vid->max_frame_num = 1 << ((char)phVar3->log2_max_frame_num_minus4 + 4U & 0x1f);
  RVar7 = phVar3->pic_width_in_mbs_minus1 + 1;
  p_Vid->PicWidthInMbs = RVar7;
  iVar2 = phVar3->frame_mbs_only_flag;
  RVar10 = (phVar3->pic_height_in_map_units_minus1 + 1) * (2 - iVar2);
  p_Vid->FrameHeightInMbs = RVar10;
  iVar13 = phVar3->chroma_format_idc;
  lVar12 = (long)iVar13;
  p_Vid->yuv_format = iVar13;
  p_Vid->frame_mbs_only_flag = iVar2;
  iVar8 = RVar7 * 0x10;
  p_Vid->width = iVar8;
  iVar11 = RVar10 * 0x10;
  p_Vid->height = iVar11;
  p_Vid->bit_depth_luma = phVar3->bit_depth_luma_minus8 + 8;
  p_Vid->bit_depth_chroma = phVar3->bit_depth_chroma_minus8 + 8;
  if (lVar12 == 2) {
    p_Vid->width_cr = iVar8 >> 1;
    iVar13 = iVar11;
  }
  else {
    if (iVar13 != 1) goto LAB_00190e0a;
    p_Vid->width_cr = iVar8 >> 1;
    iVar13 = iVar11 >> 1;
  }
  p_Vid->height_cr = iVar13;
LAB_00190e0a:
  iVar13 = 0;
  iVar15 = 0;
  if (phVar3->frame_cropping_flag != 0) {
    iVar13 = (phVar3->frame_crop_right_offset + phVar3->frame_crop_left_offset) *
             h264e_sps_to_packet::SubWidthC[lVar12];
    iVar15 = (phVar3->frame_crop_bottom_offset + phVar3->frame_crop_top_offset) *
             (iVar2 + -2) * h264e_sps_to_packet::SubHeightC[lVar12];
  }
  p_Vid->width_after_crop = iVar8 - iVar13;
  p_Vid->height_after_crop = iVar15 + iVar11;
  return MPP_OK;
}

Assistant:

MPP_RET activate_sps(H264dVideoCtx_t *p_Vid, H264_SPS_t *sps, H264_subSPS_t *subset_sps)
{
    MPP_RET ret = MPP_ERR_UNKNOW;
    INP_CHECK(ret, !p_Vid && !sps && !subset_sps);
    if (p_Vid->dec_pic) {
        FUN_CHECK(ret = exit_picture(p_Vid, &p_Vid->dec_pic));
    }
    if (p_Vid->active_mvc_sps_flag) { // layer_id == 1
        p_Vid->active_sps = &subset_sps->sps;
        p_Vid->active_subsps = subset_sps;
        p_Vid->active_sps_id[0] = 0;
        p_Vid->active_sps_id[1] = subset_sps->sps.seq_parameter_set_id;
        if (video_pars_changed(p_Vid, p_Vid->active_sps, 1)) {
            FUN_CHECK(ret = flush_dpb(p_Vid->p_Dpb_layer[1], 2));
            FUN_CHECK(ret = init_dpb(p_Vid, p_Vid->p_Dpb_layer[1], 2));
            FUN_CHECK(ret = check_mvc_dpb(p_Vid, p_Vid->p_Dpb_layer[0], p_Vid->p_Dpb_layer[1]));
            update_last_video_pars(p_Vid, p_Vid->active_sps, 1);
            //!< init frame slots, store frame buffer size
            p_Vid->dpb_size[1] = p_Vid->p_Dpb_layer[1]->size;
            p_Vid->spspps_update = 1;
            if (p_Vid->p_Dec->mvc_valid && p_Vid->p_Dpb_layer[1]->size > 0) {
                p_Vid->p_Dpb_layer[0]->size = MPP_MIN(p_Vid->p_Dpb_layer[1]->size, MAX_DPB_SIZE / 2);
                p_Vid->dpb_size[0] = p_Vid->p_Dpb_layer[0]->size;
            }
        }
        VAL_CHECK(ret, p_Vid->dpb_size[1] > 0);
    } else { //!< layer_id == 0
        p_Vid->active_sps = sps;
        p_Vid->active_subsps = NULL;
        p_Vid->active_sps_id[0] = sps->seq_parameter_set_id;
        p_Vid->active_sps_id[1] = 0;
        if (video_pars_changed(p_Vid, p_Vid->active_sps, 0)) {
            if (!p_Vid->no_output_of_prior_pics_flag) {
                FUN_CHECK(ret = flush_dpb(p_Vid->p_Dpb_layer[0], 1));
            }
            FUN_CHECK(ret = init_dpb(p_Vid, p_Vid->p_Dpb_layer[0], 1));
            update_last_video_pars(p_Vid, p_Vid->active_sps, 0);
            //!< init frame slots, store frame buffer size
            p_Vid->dpb_size[0] = p_Vid->p_Dpb_layer[0]->size;
            p_Vid->spspps_update = 1;
        }
        VAL_CHECK(ret, p_Vid->dpb_size[0] > 0);
    }
    H264D_DBG(H264D_DBG_DPB_INFO, "[DPB_size] dpb_size[0]=%d, mvc_flag=%d, dpb_size[1]=%d",
              p_Vid->dpb_size[0], p_Vid->active_mvc_sps_flag, p_Vid->dpb_size[1]);
    update_video_pars(p_Vid, p_Vid->active_sps);
__RETURN:
    return ret = MPP_OK;
__FAILED:
    return ret;
}